

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

WitnessVersion __thiscall cfd::core::Script::GetWitnessVersion(Script *this)

{
  WitnessVersion WVar1;
  ScriptType SVar2;
  bool bVar3;
  
  bVar3 = IsWitnessProgram(this);
  if (bVar3) {
    SVar2 = (((this->script_stack_).
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_start)->op_code_).data_type_;
    WVar1 = SVar2 - kOpReserved;
    if (SVar2 == kOpFalse) {
      WVar1 = kVersion0;
    }
    if (SVar2 == kOpFalse || 0xffffffef < SVar2 - kOpNop) {
      return WVar1;
    }
  }
  return kVersionNone;
}

Assistant:

WitnessVersion Script::GetWitnessVersion() const {
  if (IsWitnessProgram()) {
    auto val = script_stack_[0].GetOpCode().GetDataType();
    if (kOp_0 == val) {
      return WitnessVersion::kVersion0;
    } else if ((kOp_1 <= val) && (val <= kOp_16)) {
      auto num = val - kOp_1;
      auto version = WitnessVersion::kVersion1 + num;
      return static_cast<WitnessVersion>(version);
    }
  }
  return WitnessVersion::kVersionNone;
}